

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PropertyDescriptor.cpp
# Opt level: O3

void __thiscall
Js::PropertyDescriptor::SetAttributes
          (PropertyDescriptor *this,PropertyAttributes attributes,PropertyAttributes mask)

{
  if ((mask & 2) != 0) {
    this->Configurable = (Type)(attributes >> 1 & 1);
    this->configurableSpecified = true;
  }
  if ((mask & 1) != 0) {
    this->Enumerable = (Type)(attributes & 1);
    this->enumerableSpecified = true;
  }
  if ((mask & 4) != 0) {
    this->Writable = (Type)(attributes >> 2 & 1);
    this->writableSpecified = true;
  }
  return;
}

Assistant:

void PropertyDescriptor::SetAttributes(PropertyAttributes attributes, PropertyAttributes mask)
    {
        if (mask & PropertyConfigurable)
        {
            this->SetConfigurable(PropertyNone != (attributes & PropertyConfigurable));
        }
        if (mask & PropertyEnumerable)
        {
            this->SetEnumerable(PropertyNone != (attributes & PropertyEnumerable));
        }
        if (mask & PropertyWritable)
        {
            this->SetWritable(PropertyNone != (attributes & PropertyWritable));
        }
    }